

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O2

bool __thiscall
ON_RenderContentPrivate::ChangeChild
          (ON_RenderContentPrivate *this,ON_RenderContent *old_child,ON_RenderContent *new_child)

{
  ON_RenderContentPrivate *pOVar1;
  ON_RenderContentPrivate *pOVar2;
  ON_RenderContent *pOVar3;
  ON_RenderContent **ppOVar4;
  
  if (old_child == (ON_RenderContent *)0x0) {
    return false;
  }
  if (this->m_first_child == old_child) {
    ppOVar4 = &this->m_first_child;
    if (new_child == (ON_RenderContent *)0x0) {
      *ppOVar4 = old_child->_private->m_next_sibling;
      goto LAB_005a4743;
    }
  }
  else {
    pOVar3 = FindPrevSibling(this,old_child);
    if (pOVar3 == (ON_RenderContent *)0x0) {
      return false;
    }
    if (new_child == (ON_RenderContent *)0x0) {
      pOVar3->_private->m_next_sibling = old_child->_private->m_next_sibling;
      goto LAB_005a4743;
    }
    ppOVar4 = &pOVar3->_private->m_next_sibling;
  }
  *ppOVar4 = new_child;
  pOVar1 = old_child->_private;
  pOVar2 = new_child->_private;
  pOVar2->m_next_sibling = pOVar1->m_next_sibling;
  pOVar2->m_parent = pOVar1->m_parent;
LAB_005a4743:
  (*(old_child->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[4])(old_child);
  return true;
}

Assistant:

bool ON_RenderContentPrivate::ChangeChild(ON_RenderContent* old_child, ON_RenderContent* new_child)
{
  if (nullptr == old_child)
    return false;

  if (old_child == m_first_child)
  {
    if (nullptr != new_child)
    {
      m_first_child = new_child;
    }
    else
    {
      m_first_child = old_child->_private->m_next_sibling;
    }
  }
  else
  {
    const ON_RenderContent* prev_sibling = FindPrevSibling(old_child);
    if (nullptr == prev_sibling)
      return false;

    if (nullptr != new_child)
    {
      prev_sibling->_private->m_next_sibling = new_child;
    }
    else
    {
      prev_sibling->_private->m_next_sibling = old_child->_private->m_next_sibling;
    }
  }

  if (nullptr != new_child)
  {
    new_child->_private->m_next_sibling = old_child->_private->m_next_sibling;
    new_child->_private->m_parent = old_child->_private->m_parent;
  }

  delete old_child;

  return true;
}